

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O3

Gia_Man_t * Gia_ManBuildGig2(Vec_Int_t *vObjs,Vec_Int_t *vStore,char *pFileName)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Int_t *p_00;
  undefined4 *__s;
  Gia_Man_t *p_01;
  size_t sVar4;
  char *pcVar5;
  Gia_Man_t *pGVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint *local_58;
  uint local_40;
  
  iVar2 = vObjs->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar8 = iVar2;
  }
  p->nSize = 0;
  p->nCap = iVar8;
  if (iVar8 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar8 * 4);
  }
  p->pArray = piVar3;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nSize = 0;
  p_00->nCap = iVar8;
  if (iVar8 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar8 << 2);
  }
  p_00->pArray = piVar3;
  if (iVar2 < 1) {
LAB_006b55ff:
    local_58 = (uint *)malloc(0x10);
    uVar1 = 1;
    local_40 = 0;
LAB_006b5611:
    *local_58 = 0x10;
    uVar10 = 0x10;
  }
  else {
    lVar11 = 0;
    do {
      iVar2 = vObjs->pArray[lVar11];
      if (((((long)iVar2 < 0) || (vStore->nSize <= iVar2)) ||
          (Vec_IntPush(p,vStore->pArray[iVar2]), vObjs->nSize <= lVar11)) ||
         ((vObjs->pArray[lVar11] < -1 ||
          (uVar1 = vObjs->pArray[lVar11] + 1, vStore->nSize <= (int)uVar1)))) goto LAB_006b586f;
      Vec_IntPush(p_00,vStore->pArray[uVar1]);
      lVar11 = lVar11 + 1;
      iVar2 = vObjs->nSize;
    } while (lVar11 < iVar2);
    local_40 = p->nSize;
    if ((ulong)local_40 == 0) goto LAB_006b55ff;
    uVar10 = *p->pArray;
    if (1 < (int)local_40) {
      uVar7 = 1;
      do {
        uVar1 = p->pArray[uVar7];
        if ((int)uVar10 <= (int)uVar1) {
          uVar10 = uVar1;
        }
        uVar7 = uVar7 + 1;
      } while (local_40 != uVar7);
    }
    uVar1 = uVar10 + 1;
    local_58 = (uint *)malloc(0x10);
    if (uVar10 < 0xf) goto LAB_006b5611;
    *local_58 = uVar1;
    uVar10 = uVar1;
    if (uVar1 == 0) {
      uVar1 = 0;
      __s = (undefined4 *)0x0;
      goto LAB_006b563d;
    }
  }
  __s = (undefined4 *)malloc((long)(int)uVar10 << 2);
LAB_006b563d:
  *(undefined4 **)(local_58 + 2) = __s;
  local_58[1] = uVar1;
  memset(__s,0xff,(long)(int)uVar1 * 4);
  if (((int)uVar1 < 1) || (*__s = 0, uVar1 == 1)) {
LAB_006b588e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __s[1] = 1;
  p_01 = Gia_ManStart(iVar2);
  if (pFileName == (char *)0x0) {
    p_01->pName = (char *)0x0;
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pFileName);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pFileName);
    p_01->pName = pcVar5;
    sVar4 = strlen(pFileName);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pFileName);
  }
  p_01->pSpec = pcVar5;
  iVar2 = vObjs->nSize;
  if (0 < iVar2) {
    uVar9 = 0;
    uVar7 = (ulong)(uint)p_00->nSize;
    if (p_00->nSize < 1) {
      uVar7 = uVar9;
    }
    do {
      if (uVar7 == uVar9) goto LAB_006b586f;
      if (p_00->pArray[uVar9] == 2) {
        if ((long)(int)local_40 <= (long)uVar9) goto LAB_006b586f;
        uVar10 = p->pArray[uVar9];
        iVar2 = Gia_ManAppendCi(p_01);
        if (uVar1 <= uVar10) goto LAB_006b588e;
        __s[uVar10] = iVar2;
        iVar2 = vObjs->nSize;
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)iVar2);
    if (0 < iVar2) {
      uVar9 = 0;
      uVar7 = (ulong)(uint)p_00->nSize;
      if (p_00->nSize < 1) {
        uVar7 = uVar9;
      }
      do {
        if (uVar7 == uVar9) goto LAB_006b586f;
        if (p_00->pArray[uVar9] == 7) {
          if ((long)(int)local_40 <= (long)uVar9) goto LAB_006b586f;
          uVar10 = p->pArray[uVar9];
          iVar2 = Gia_ManAppendCi(p_01);
          if (uVar1 <= uVar10) goto LAB_006b588e;
          __s[uVar10] = iVar2;
          iVar2 = vObjs->nSize;
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)iVar2);
    }
  }
  Gia_ManHashAlloc(p_01);
  if (0 < vObjs->nSize) {
    uVar1 = 0;
    if (0 < p_00->nSize) {
      uVar1 = p_00->nSize;
    }
    if (uVar1 <= vObjs->nSize - 1U) {
LAB_006b586f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  free(__s);
  free(local_58);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  pGVar6 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManBuildGig2( Vec_Int_t * vObjs, Vec_Int_t * vStore, char * pFileName )
{
    Gia_Man_t * pNew, * pTemp;
    //int * nObjs = Gia_ManGigCount( vObjs, vStore );
    Vec_Int_t * vNets = Vec_IntAlloc( Vec_IntSize(vObjs) );
    Vec_Int_t * vTypes = Vec_IntAlloc( Vec_IntSize(vObjs) );
    Vec_Int_t * vMap;
    int i, Type;
    // connect net IDs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        Vec_IntPush( vNets, Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i)) );
        Vec_IntPush( vTypes, Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i) + 1) );
    }
    // create mapping for net IDs into GIA IDs
    vMap = Vec_IntStartFull( Vec_IntFindMax(vNets) + 1 ); 
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    // create new manager
    pNew = Gia_ManStart( Vec_IntSize(vObjs) );
    pNew->pName = Abc_UtilStrsav( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    // create primary inputs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        if ( Vec_IntEntry(vTypes, i) == GIG_PI )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vNets, i), Gia_ManAppendCi(pNew) );
    // create box outputs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        if ( Vec_IntEntry(vTypes, i) == GIG_BOX )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vNets, i), Gia_ManAppendCi(pNew) );
    // create internal nodes
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        Type = Vec_IntEntry(vTypes, i);
        if ( Type != GIG_LUT && Type != GIG_DELAY && Type != GIG_BAR )
            continue;

    }
    Vec_IntFree( vMap );
    Vec_IntFree( vNets );
    Vec_IntFree( vTypes );
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}